

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O0

int __thiscall axl::io::SimpleMappedFile::open(SimpleMappedFile *this,char *__file,int __oflag,...)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined7 uVar4;
  undefined4 extraout_var;
  long in_RCX;
  uint in_R8D;
  bool result;
  bool local_39;
  bool local_1;
  
  close(this,(int)__file);
  uVar1 = File::open(&this->m_file,__file,in_R8D);
  uVar3 = (ulong)uVar1 & 0xffffffffffffff01;
  if ((char)uVar3 == '\0') {
    local_1 = false;
  }
  else {
    this->m_openFlags = in_R8D;
    uVar4 = (undefined7)((ulong)this >> 8);
    local_39 = true;
    if (in_RCX != 0) {
      iVar2 = Mapping::open(&this->m_mapping,(char *)this,__oflag,in_RCX,(ulong)in_R8D);
      local_39 = CONCAT44(extraout_var,iVar2) != 0;
      uVar4 = (undefined7)((ulong)CONCAT44(extraout_var,iVar2) >> 8);
    }
    uVar3 = CONCAT71(uVar4,local_39);
    local_1 = local_39;
  }
  return (int)CONCAT71((int7)(uVar3 >> 8),local_1);
}

Assistant:

bool
SimpleMappedFile::open(
	const sl::StringRef& fileName,
	uint64_t offset,
	size_t size,
	uint_t flags
) {
	bool result;

	close();

	result = m_file.open(fileName, flags);
	if (!result)
		return false;

	m_openFlags = flags;
	return !size || m_mapping.open(&m_file, offset, size, flags);
}